

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_validate.cc
# Opt level: O0

void VW::validate_version(vw *all)

{
  bool bVar1;
  undefined8 uVar2;
  ostream *poVar3;
  stringstream __msg;
  string *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  stringstream local_190 [16];
  stringstream local_180 [72];
  version_struct *in_stack_fffffffffffffec8;
  
  bVar1 = version_struct::operator<
                    ((version_struct *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                     ,(char *)in_stack_fffffffffffffe28);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_190);
    poVar3 = std::operator<<((ostream *)(local_190 + 0x10),
                             "Model has possibly incompatible version! ");
    version_struct::to_string_abi_cxx11_(in_stack_fffffffffffffec8);
    std::operator<<(poVar3,(string *)&stack0xfffffffffffffe40);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
    uVar2 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    vw_exception::vw_exception
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
               in_stack_fffffffffffffe28);
    __cxa_throw(uVar2,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  bVar1 = version_struct::operator>
                    ((version_struct *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                     ,(char *)in_stack_fffffffffffffe28);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Warning: model version is more recent than VW version.  This may not work."
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void validate_version(vw& all)
{
  if (all.model_file_ver < LAST_COMPATIBLE_VERSION)
    THROW("Model has possibly incompatible version! " << all.model_file_ver.to_string());
  if (all.model_file_ver > PACKAGE_VERSION)
    std::cerr << "Warning: model version is more recent than VW version.  This may not work." << std::endl;
}